

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int setcharset(uchar **p,uchar *charset)

{
  long lVar1;
  int iVar2;
  uchar *local_30;
  uchar *pp;
  uchar c;
  _Bool something_found;
  uchar *puStack_20;
  setcharset_state state;
  uchar *charset_local;
  uchar **p_local;
  
  pp._4_4_ = 0;
  pp._3_1_ = 0;
  puStack_20 = charset;
  charset_local = (uchar *)p;
  memset(charset,0,0x10f);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          pp._2_1_ = **(byte **)charset_local;
          if (pp._2_1_ == 0) {
            return 0;
          }
          if (pp._4_4_ != 0) break;
          if (pp._2_1_ == 0x5d) {
            if ((pp._3_1_ & 1) != 0) {
              return 1;
            }
            pp._3_1_ = 1;
            pp._4_4_ = 1;
            puStack_20[0x5d] = '\x01';
            *(long *)charset_local = *(long *)charset_local + 1;
          }
          else if (pp._2_1_ == 0x5b) {
            local_30 = (uchar *)(*(long *)charset_local + 2);
            if ((*(char *)(*(long *)charset_local + 1) == ':') &&
               (iVar2 = parsekeyword(&local_30,puStack_20), iVar2 != 0)) {
              *(uchar **)charset_local = local_30;
            }
            else {
              puStack_20[pp._2_1_] = '\x01';
              *(long *)charset_local = *(long *)charset_local + 1;
            }
            pp._3_1_ = 1;
          }
          else if ((pp._2_1_ == 0x5e) || (pp._2_1_ == 0x21)) {
            if ((pp._3_1_ & 1) == 0) {
              if (puStack_20[0x100] == '\0') {
                puStack_20[0x100] = '\x01';
              }
              else {
                puStack_20[pp._2_1_] = '\x01';
                pp._3_1_ = 1;
              }
            }
            else {
              puStack_20[pp._2_1_] = '\x01';
            }
            *(long *)charset_local = *(long *)charset_local + 1;
          }
          else {
            if (pp._2_1_ == 0x5c) {
              lVar1 = *(long *)charset_local;
              *(long *)charset_local = lVar1 + 1;
              pp._2_1_ = *(char *)(lVar1 + 1);
              if (pp._2_1_ == '\0') {
                puStack_20[0x5c] = '\x01';
              }
              else {
                setcharorrange((uchar **)charset_local,puStack_20);
              }
            }
            else {
              setcharorrange((uchar **)charset_local,puStack_20);
            }
            pp._3_1_ = 1;
          }
        }
        if (pp._4_4_ == 1) break;
        if (pp._4_4_ == 2) {
          if (pp._2_1_ == 0x5d) {
            return 1;
          }
          pp._4_4_ = 0;
          puStack_20[pp._2_1_] = '\x01';
          *(long *)charset_local = *(long *)charset_local + 1;
        }
      }
      if (pp._2_1_ != 0x5b) break;
      pp._4_4_ = 2;
      puStack_20[0x5b] = '\x01';
      *(long *)charset_local = *(long *)charset_local + 1;
    }
    if (pp._2_1_ == 0x5d) {
      return 1;
    }
    iVar2 = Curl_isprint((uint)pp._2_1_);
    if (iVar2 == 0) break;
    puStack_20[pp._2_1_] = '\x01';
    *(long *)charset_local = *(long *)charset_local + 1;
    pp._4_4_ = 0;
  }
  return 0;
}

Assistant:

static int setcharset(unsigned char **p, unsigned char *charset)
{
  setcharset_state state = CURLFNM_SCHS_DEFAULT;
  bool something_found = FALSE;
  unsigned char c;

  memset(charset, 0, CURLFNM_CHSET_SIZE);
  for(;;) {
    c = **p;
    if(!c)
      return SETCHARSET_FAIL;

    switch(state) {
    case CURLFNM_SCHS_DEFAULT:
      if(c == ']') {
        if(something_found)
          return SETCHARSET_OK;
        something_found = TRUE;
        state = CURLFNM_SCHS_RIGHTBR;
        charset[c] = 1;
        (*p)++;
      }
      else if(c == '[') {
        unsigned char *pp = *p + 1;

        if(*pp++ == ':' && parsekeyword(&pp, charset))
          *p = pp;
        else {
          charset[c] = 1;
          (*p)++;
        }
        something_found = TRUE;
      }
      else if(c == '^' || c == '!') {
        if(!something_found) {
          if(charset[CURLFNM_NEGATE]) {
            charset[c] = 1;
            something_found = TRUE;
          }
          else
            charset[CURLFNM_NEGATE] = 1; /* negate charset */
        }
        else
          charset[c] = 1;
        (*p)++;
      }
      else if(c == '\\') {
        c = *(++(*p));
        if(c)
          setcharorrange(p, charset);
        else
          charset['\\'] = 1;
        something_found = TRUE;
      }
      else {
        setcharorrange(p, charset);
        something_found = TRUE;
      }
      break;
    case CURLFNM_SCHS_RIGHTBR:
      if(c == '[') {
        state = CURLFNM_SCHS_RIGHTBRLEFTBR;
        charset[c] = 1;
        (*p)++;
      }
      else if(c == ']') {
        return SETCHARSET_OK;
      }
      else if(ISPRINT(c)) {
        charset[c] = 1;
        (*p)++;
        state = CURLFNM_SCHS_DEFAULT;
      }
      else
        /* used 'goto fail' instead of 'return SETCHARSET_FAIL' to avoid a
         * nonsense warning 'statement not reached' at end of the fnc when
         * compiling on Solaris */
        goto fail;
      break;
    case CURLFNM_SCHS_RIGHTBRLEFTBR:
      if(c == ']')
        return SETCHARSET_OK;
      state  = CURLFNM_SCHS_DEFAULT;
      charset[c] = 1;
      (*p)++;
      break;
    }
  }
fail:
  return SETCHARSET_FAIL;
}